

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_frozen_view(char *buf,size_t maxbytes)

{
  long lVar1;
  long lVar2;
  long lVar3;
  container_t **ppcVar4;
  long *plVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  uint64_t uVar9;
  container_t *pcVar10;
  long in_RSI;
  uint8_t *in_RDI;
  uint64_t index;
  uint32_t elem_count;
  uint16_t compressed_elem_count;
  uint8_t typecode;
  leaf_t leaf;
  size_t i;
  art_iterator_t it;
  uint16_t *arrays;
  rle16_t *runs;
  uint64_t *bitsets;
  char *before_containers;
  size_t art_size;
  uint64_t total_sizes [4];
  char *elem_counts;
  roaring64_bitmap_t *r;
  undefined1 in_stack_fffffffffffffeef;
  art_t *in_stack_fffffffffffffef0;
  rle16_t **runs_00;
  art_t *in_stack_fffffffffffffef8;
  uint16_t **arrays_00;
  uint64_t **in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  roaring64_bitmap_t *in_stack_ffffffffffffff70;
  roaring64_bitmap_t *local_8;
  
  if (in_RDI == (uint8_t *)0x0) {
    local_8 = (roaring64_bitmap_t *)0x0;
  }
  else if (((ulong)in_RDI & 0x3f) == 0) {
    local_8 = roaring64_bitmap_create();
    if (in_RSI == 0) {
      roaring64_bitmap_free(in_stack_ffffffffffffff70);
      local_8 = (roaring64_bitmap_t *)0x0;
    }
    else {
      local_8->flags = *in_RDI;
      local_8->flags = local_8->flags | 2;
      if (in_RSI - 1U < 8) {
        roaring64_bitmap_free(in_stack_ffffffffffffff70);
        local_8 = (roaring64_bitmap_t *)0x0;
      }
      else {
        local_8->capacity = *(uint64_t *)(in_RDI + 1);
        ppcVar4 = (container_t **)roaring_malloc(0x142877);
        local_8->containers = ppcVar4;
        if (in_RSI - 9U < local_8->capacity << 1) {
          roaring64_bitmap_free(in_stack_ffffffffffffff70);
          local_8 = (roaring64_bitmap_t *)0x0;
        }
        else {
          plVar5 = (long *)(in_RDI + local_8->capacity * 2 + 9);
          uVar6 = (in_RSI - 9U) + local_8->capacity * -2;
          if (uVar6 < 0x18) {
            roaring64_bitmap_free(in_stack_ffffffffffffff70);
            local_8 = (roaring64_bitmap_t *)0x0;
          }
          else {
            lVar1 = *plVar5;
            lVar2 = plVar5[1];
            lVar3 = plVar5[2];
            sVar7 = art_frozen_view((char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08),
                                    (size_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
            if (sVar7 == 0) {
              roaring64_bitmap_free(in_stack_ffffffffffffff70);
              local_8 = (roaring64_bitmap_t *)0x0;
            }
            else {
              lVar8 = sVar7 + ((ulong)((long)plVar5 + 0x1f) & 0xfffffffffffffff8);
              if ((uVar6 - 0x18) - sVar7 <
                  (lVar3 + (lVar2 + (lVar1 + (lVar8 + 0x3fU & 0xffffffffffffffc0) + 1 &
                                    0xfffffffffffffffe) + 1 & 0xfffffffffffffffe)) - lVar8) {
                roaring64_bitmap_free(in_stack_ffffffffffffff70);
                local_8 = (roaring64_bitmap_t *)0x0;
              }
              else {
                art_init_iterator(in_stack_fffffffffffffef0,(_Bool)in_stack_fffffffffffffeef);
                arrays_00 = (uint16_t **)0x0;
                while (CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08) != 0) {
                  runs_00 = *(rle16_t ***)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
                  get_typecode((leaf_t)runs_00);
                  uVar9 = get_index((leaf_t)runs_00);
                  pcVar10 = container_frozen_view
                                      ((uint8_t)((uint)in_stack_ffffffffffffff0c >> 0x18),
                                       in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,arrays_00
                                       ,runs_00);
                  local_8->containers[uVar9] = pcVar10;
                  art_iterator_next((art_iterator_t *)0x142c8c);
                  arrays_00 = (uint16_t **)((long)arrays_00 + 1);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    local_8 = (roaring64_bitmap_t *)0x0;
  }
  return local_8;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_frozen_view(const char *buf,
                                                 size_t maxbytes) {
    if (buf == NULL) {
        return NULL;
    }
    if ((uintptr_t)buf % CROARING_BITSET_ALIGNMENT != 0) {
        return NULL;
    }

    roaring64_bitmap_t *r = roaring64_bitmap_create();

    // Flags.
    if (maxbytes < sizeof(r->flags)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    memcpy(&r->flags, buf, sizeof(r->flags));
    buf += sizeof(r->flags);
    maxbytes -= sizeof(r->flags);
    r->flags |= ROARING_FLAG_FROZEN;

    // Container count.
    if (maxbytes < sizeof(r->capacity)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    memcpy(&r->capacity, buf, sizeof(r->capacity));
    buf += sizeof(r->capacity);
    maxbytes -= sizeof(r->capacity);

    r->containers =
        (container_t *)roaring_malloc(r->capacity * sizeof(container_t *));

    // Container element counts.
    if (maxbytes < r->capacity * sizeof(uint16_t)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    const char *elem_counts = buf;
    buf += r->capacity * sizeof(uint16_t);
    maxbytes -= r->capacity * sizeof(uint16_t);

    // Total container sizes.
    uint64_t total_sizes[4];
    if (maxbytes < sizeof(uint64_t) * 3) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    memcpy(&(total_sizes[BITSET_CONTAINER_TYPE]), buf, sizeof(uint64_t));
    buf += sizeof(uint64_t);
    maxbytes -= sizeof(uint64_t);
    memcpy(&(total_sizes[RUN_CONTAINER_TYPE]), buf, sizeof(uint64_t));
    buf += sizeof(uint64_t);
    maxbytes -= sizeof(uint64_t);
    memcpy(&(total_sizes[ARRAY_CONTAINER_TYPE]), buf, sizeof(uint64_t));
    buf += sizeof(uint64_t);
    maxbytes -= sizeof(uint64_t);

    // ART (8 byte aligned).
    buf = CROARING_ALIGN_BUF(buf, 8);
    size_t art_size = art_frozen_view(buf, maxbytes, &r->art);
    if (art_size == 0) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    buf += art_size;
    maxbytes -= art_size;

    // Containers (aligned).
    const char *before_containers = buf;
    buf = CROARING_ALIGN_BUF(buf, CROARING_BITSET_ALIGNMENT);
    const uint64_t *bitsets = (const uint64_t *)buf;
    buf += total_sizes[BITSET_CONTAINER_TYPE];
    buf = CROARING_ALIGN_BUF(buf, alignof(rle16_t));
    const rle16_t *runs = (const rle16_t *)buf;
    buf += total_sizes[RUN_CONTAINER_TYPE];
    buf = CROARING_ALIGN_BUF(buf, alignof(uint16_t));
    const uint16_t *arrays = (const uint16_t *)buf;
    buf += total_sizes[ARRAY_CONTAINER_TYPE];
    if (maxbytes < (uint64_t)(buf - before_containers)) {
        roaring64_bitmap_free(r);
        return NULL;
    }
    maxbytes -= buf - before_containers;

    // Deserialize in ART iteration order.
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    for (size_t i = 0; it.value != NULL; ++i) {
        leaf_t leaf = (leaf_t)*it.value;
        uint8_t typecode = get_typecode(leaf);

        uint16_t compressed_elem_count;
        memcpy(&compressed_elem_count, elem_counts + (i * sizeof(uint16_t)),
               sizeof(compressed_elem_count));
        uint32_t elem_count = (uint32_t)(compressed_elem_count) + 1;

        // The container index is unrelated to the iteration order.
        uint64_t index = get_index(leaf);
        r->containers[index] = container_frozen_view(typecode, elem_count,
                                                     &bitsets, &arrays, &runs);

        art_iterator_next(&it);
    }

    // Padding to make overall size a multiple of required alignment.
    buf = CROARING_ALIGN_BUF(buf, CROARING_BITSET_ALIGNMENT);

    return r;
}